

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::setOption(Context *this,char *option,int value)

{
  ostream *this_00;
  char **value_00;
  char *local_38 [2];
  char local_21;
  
  this_00 = detail::tlssPush();
  std::ostream::operator<<(this_00,value);
  detail::tlssPop();
  value_00 = local_38;
  if (local_21 < '\0') {
    value_00 = (char **)local_38[0];
  }
  setOption(this,option,(char *)value_00);
  if ((local_21 < '\0') && (local_38[0] != (char *)0x0)) {
    operator_delete__(local_38[0]);
  }
  return;
}

Assistant:

void Context::setOption(const char* option, int value) {
    setOption(option, toString(value).c_str());
}